

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMNormalizer.cpp
# Opt level: O1

void __thiscall xercesc_4_0::DOMNormalizer::namespaceFixUp(DOMNormalizer *this,DOMElementImpl *ele)

{
  XMLCh XVar1;
  XMLCh XVar2;
  short sVar3;
  short sVar4;
  DOMAttrMapImpl *pDVar5;
  BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope> *pBVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  XMLCh *pXVar11;
  XMLCh *pXVar12;
  short *psVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  DOMNode *node;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  Scope *pSVar14;
  undefined4 extraout_var_08;
  XMLCh *pXVar15;
  short *psVar16;
  MemoryManager *pMVar17;
  XMLCh *pXVar18;
  XMLCh *pXVar19;
  InScopeNamespaces *pIVar20;
  long lVar21;
  long *plVar10;
  undefined4 extraout_var_05;
  
  pDVar5 = ele->fAttributes;
  iVar8 = (*(pDVar5->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])(pDVar5);
  if (CONCAT44(extraout_var,iVar8) != 0) {
    lVar21 = 0;
    pXVar19 = L"http://www.w3.org/2000/xmlns/";
    do {
      iVar9 = (*(pDVar5->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[3])(pDVar5,lVar21);
      plVar10 = (long *)CONCAT44(extraout_var_00,iVar9);
      (**(code **)(*plVar10 + 0xa0))(plVar10);
      pXVar11 = (XMLCh *)(**(code **)(*plVar10 + 0xb0))(plVar10);
      pXVar12 = (XMLCh *)(**(code **)(*plVar10 + 0x18))(plVar10);
      if (pXVar11 == L"http://www.w3.org/2000/xmlns/") {
LAB_0027c7e7:
        if (pXVar12 == L"http://www.w3.org/2000/xmlns/") {
LAB_0027c858:
          error(this,NSDeclInvalid,(DOMNode *)ele);
        }
        else {
          pXVar11 = pXVar12;
          pXVar18 = pXVar19;
          pXVar15 = pXVar19;
          if (pXVar12 == (XMLCh *)0x0) {
LAB_0027c814:
            if (*pXVar18 == L'\0') goto LAB_0027c858;
          }
          else {
            do {
              XVar1 = *pXVar15;
              pXVar18 = pXVar11;
              if (XVar1 == L'\0') goto LAB_0027c814;
              XVar2 = *pXVar11;
              pXVar11 = pXVar11 + 1;
              pXVar15 = pXVar15 + 1;
            } while (XVar1 == XVar2);
          }
          psVar13 = (short *)(**(code **)(*plVar10 + 0xb8))(plVar10);
          if (psVar13 == &XMLUni::fgXMLNSString) {
LAB_0027c88a:
            pIVar20 = this->fNSScope;
            pXVar11 = (XMLCh *)(**(code **)(*plVar10 + 0xc0))(plVar10);
            pMVar17 = this->fMemoryManager;
          }
          else {
            psVar16 = &XMLUni::fgXMLNSString;
            if (psVar13 == (short *)0x0) {
LAB_0027c86e:
              if (*psVar16 == 0) goto LAB_0027c88a;
            }
            else {
              psVar16 = &XMLUni::fgXMLNSString;
              do {
                sVar3 = *psVar13;
                if (sVar3 == 0) goto LAB_0027c86e;
                psVar13 = psVar13 + 1;
                sVar4 = *psVar16;
                psVar16 = psVar16 + 1;
              } while (sVar3 == sVar4);
            }
            pIVar20 = this->fNSScope;
            pMVar17 = this->fMemoryManager;
            pXVar11 = L"";
          }
          InScopeNamespaces::addOrChangeBinding(pIVar20,pXVar11,pXVar12,pMVar17);
        }
      }
      else {
        pXVar18 = pXVar19;
        pXVar15 = pXVar19;
        if (pXVar11 == (XMLCh *)0x0) {
LAB_0027c7dd:
          if (*pXVar18 == L'\0') goto LAB_0027c7e7;
        }
        else {
          do {
            XVar1 = *pXVar15;
            pXVar18 = pXVar11;
            if (XVar1 == L'\0') goto LAB_0027c7dd;
            XVar2 = *pXVar11;
            pXVar11 = pXVar11 + 1;
            pXVar15 = pXVar15 + 1;
          } while (XVar1 == XVar2);
        }
      }
      lVar21 = lVar21 + 1;
    } while (lVar21 != CONCAT44(extraout_var,iVar8));
  }
  iVar8 = (*(ele->super_DOMElement).super_DOMNode._vptr_DOMNode[0x17])(ele);
  pXVar19 = (XMLCh *)CONCAT44(extraout_var_01,iVar8);
  if (pXVar19 == (XMLCh *)0x0) {
    pXVar19 = L"";
  }
  iVar8 = (*(ele->super_DOMElement).super_DOMNode._vptr_DOMNode[0x16])(ele);
  pXVar11 = (XMLCh *)CONCAT44(extraout_var_02,iVar8);
  if (pXVar11 == L"" || pXVar11 == (XMLCh *)0x0) {
LAB_0027c915:
    iVar8 = (*(ele->super_DOMElement).super_DOMNode._vptr_DOMNode[0x18])(ele);
    if (CONCAT44(extraout_var_03,iVar8) == 0) {
      error(this,DOMLevel1Node,(DOMNode *)ele);
      goto LAB_0027c9f8;
    }
    bVar7 = InScopeNamespaces::isValidBinding(this->fNSScope,L"",L"");
    if (bVar7) goto LAB_0027c9f8;
    (*(ele->super_DOMElement).super_DOMNode._vptr_DOMNode[0x31])
              (ele,&XMLUni::fgXMLNSURIName,&XMLUni::fgXMLNSString,&XMLUni::fgZeroLenString);
    pIVar20 = this->fNSScope;
    pMVar17 = this->fMemoryManager;
    pXVar19 = L"";
    pXVar11 = L"";
  }
  else {
    lVar21 = 0;
    do {
      psVar13 = (short *)((long)pXVar11 + lVar21);
      if (*psVar13 == 0) {
        if (*(short *)((long)&XMLUni::fgZeroLenString + lVar21) == 0) goto LAB_0027c915;
        break;
      }
      psVar16 = (short *)((long)&XMLUni::fgZeroLenString + lVar21);
      lVar21 = lVar21 + 2;
    } while (*psVar13 == *psVar16);
    bVar7 = InScopeNamespaces::isValidBinding(this->fNSScope,pXVar19,pXVar11);
    if (bVar7) goto LAB_0027c9f8;
    addOrChangeNamespaceDecl(this,pXVar19,pXVar11,ele);
    pIVar20 = this->fNSScope;
    pMVar17 = this->fMemoryManager;
  }
  InScopeNamespaces::addOrChangeBinding(pIVar20,pXVar19,pXVar11,pMVar17);
LAB_0027c9f8:
  iVar8 = (*(pDVar5->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[5])(pDVar5);
  if (CONCAT44(extraout_var_04,iVar8) != 0) {
    lVar21 = 0;
    do {
      iVar9 = (*(pDVar5->super_DOMNamedNodeMap)._vptr_DOMNamedNodeMap[3])(pDVar5,lVar21);
      node = (DOMNode *)CONCAT44(extraout_var_05,iVar9);
      iVar9 = (*node->_vptr_DOMNode[0x16])(node);
      pXVar19 = (XMLCh *)CONCAT44(extraout_var_06,iVar9);
      iVar9 = (*node->_vptr_DOMNode[0x17])(node);
      pXVar11 = (XMLCh *)CONCAT44(extraout_var_07,iVar9);
      if (pXVar19 != L"http://www.w3.org/2000/xmlns/") {
        pXVar12 = L"http://www.w3.org/2000/xmlns/";
        if (pXVar19 == (XMLCh *)0x0) {
LAB_0027ca82:
          if (*pXVar12 == L'\0') goto LAB_0027cbac;
        }
        else {
          pXVar18 = L"http://www.w3.org/2000/xmlns/";
          pXVar12 = pXVar19;
          do {
            XVar1 = *pXVar18;
            if (XVar1 == L'\0') goto LAB_0027ca82;
            pXVar18 = pXVar18 + 1;
            XVar2 = *pXVar12;
            pXVar12 = pXVar12 + 1;
          } while (XVar1 == XVar2);
        }
        if (pXVar19 == (XMLCh *)0x0) {
          iVar9 = (*node->_vptr_DOMNode[0x18])(node);
          if (CONCAT44(extraout_var_08,iVar9) == 0) {
            error(this,DOMLevel1Node,node);
          }
        }
        else if ((pXVar11 == (XMLCh *)0x0) ||
                (bVar7 = InScopeNamespaces::isValidBinding(this->fNSScope,pXVar11,pXVar19), !bVar7))
        {
          pBVar6 = &this->fNSScope->fScopes->
                    super_BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope>;
          pSVar14 = BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope>::elementAt
                              (pBVar6,pBVar6->fCurCount - 1);
          pXVar12 = InScopeNamespaces::Scope::getPrefix(pSVar14,pXVar19);
          if (pXVar12 == (XMLCh *)0x0) {
            if (pXVar11 != (XMLCh *)0x0) {
              pBVar6 = &this->fNSScope->fScopes->
                        super_BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope>;
              pSVar14 = BaseRefVectorOf<xercesc_4_0::DOMNormalizer::InScopeNamespaces::Scope>::
                        elementAt(pBVar6,pBVar6->fCurCount - 1);
              pXVar12 = InScopeNamespaces::Scope::getUri(pSVar14,pXVar11);
              if (pXVar12 == (XMLCh *)0x0) {
                InScopeNamespaces::addOrChangeBinding
                          (this->fNSScope,pXVar11,pXVar19,this->fMemoryManager);
                addOrChangeNamespaceDecl(this,pXVar11,pXVar19,ele);
                goto LAB_0027cbac;
              }
            }
            pXVar11 = addCustomNamespaceDecl(this,pXVar19,ele);
            InScopeNamespaces::addOrChangeBinding
                      (this->fNSScope,pXVar11,pXVar19,this->fMemoryManager);
            (*node->_vptr_DOMNode[0x19])(node,pXVar11);
          }
          else {
            (*node->_vptr_DOMNode[0x19])(node,pXVar12);
          }
        }
      }
LAB_0027cbac:
      lVar21 = lVar21 + 1;
    } while (lVar21 != CONCAT44(extraout_var_04,iVar8));
  }
  return;
}

Assistant:

void DOMNormalizer::namespaceFixUp(DOMElementImpl *ele) const {
    DOMAttrMapImpl *attrMap = ele->fAttributes;

    XMLSize_t len = attrMap->getLength();
    //get the ns info from the attrs
    for(XMLSize_t i = 0; i < len; i++) {
        DOMAttr *at = (DOMAttr*)attrMap->item(i);

        //normalize the attr whatever happens
        at->normalize();

        const XMLCh *uri = at->getNamespaceURI();
        const XMLCh *value = at->getNodeValue();

        if(XMLString::equals(XMLUni::fgXMLNSURIName, uri)) {
            if(XMLString::equals(XMLUni::fgXMLNSURIName, value)) {
                error(XMLErrs::NSDeclInvalid, ele);
            }
            else {
                const XMLCh *prefix = at->getPrefix();

                if(XMLString::equals(prefix, XMLUni::fgXMLNSString)) {
                    fNSScope->addOrChangeBinding(at->getLocalName(), value, fMemoryManager);
                }
                else {
                    fNSScope->addOrChangeBinding(XMLUni::fgZeroLenString, value, fMemoryManager);
                }
            }
        }
    }

    const XMLCh* prefix = ele->getPrefix();
    prefix ? prefix : prefix = XMLUni::fgZeroLenString;
    const XMLCh* uri = ele->getNamespaceURI();
    uri ? uri : uri = XMLUni::fgZeroLenString;

    if(!XMLString::equals(uri, XMLUni::fgZeroLenString)) {
        if(!fNSScope->isValidBinding(prefix, uri)) {
            addOrChangeNamespaceDecl(prefix, uri, ele);
            fNSScope->addOrChangeBinding(prefix, uri, fMemoryManager);
        }
    }
    else {
        if(ele->getLocalName() == 0) {
            error(XMLErrs::DOMLevel1Node, ele);
        }
        else if(!fNSScope->isValidBinding(XMLUni::fgZeroLenString, XMLUni::fgZeroLenString)) {
            addOrChangeNamespaceDecl(XMLUni::fgZeroLenString, XMLUni::fgZeroLenString, ele);
            fNSScope->addOrChangeBinding(XMLUni::fgZeroLenString, XMLUni::fgZeroLenString, fMemoryManager);
        }
    }

    //fix up non ns attrs
    len = attrMap->getLength();

    // hp aCC complains this i is a redefinition of the i on line 283
    for(XMLSize_t j = 0; j < len; j++) {
        DOMAttr *at = (DOMAttr*)attrMap->item(j);
        const XMLCh *uri = at->getNamespaceURI();
        const XMLCh* prefix = at->getPrefix();

        if(!XMLString::equals(XMLUni::fgXMLNSURIName, uri)) {
            if(uri != 0) {
                if(prefix == 0 || !fNSScope->isValidBinding(prefix, uri)) {

                    const XMLCh* newPrefix =  fNSScope->getPrefix(uri);

                    if(newPrefix != 0) {
                        at->setPrefix(newPrefix);
                    }
                    else {
                        if(prefix != 0 && !fNSScope->getUri(prefix)) {
                            fNSScope->addOrChangeBinding(prefix, uri, fMemoryManager);
                            addOrChangeNamespaceDecl(prefix, uri, ele);
                        }
                        else {
                            newPrefix = addCustomNamespaceDecl(uri, ele);
                            fNSScope->addOrChangeBinding(newPrefix, uri, fMemoryManager);
                            at->setPrefix(newPrefix);
                        }
                    }
                }
            }
            else if(at->getLocalName() == 0) {
                error(XMLErrs::DOMLevel1Node, at);
            }
        }
    }
}